

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O0

uchar * nvpair_unpack_nvlist
                  (_Bool isbe,nvpair_t *nvp,uchar *ptr,size_t *leftp,size_t nfds,nvlist_t **child)

{
  int *piVar1;
  nvlist_t *nvl;
  nvlist_t *value;
  nvlist_t **child_local;
  size_t nfds_local;
  size_t *leftp_local;
  uchar *ptr_local;
  nvpair_t *nvp_local;
  uchar *puStack_10;
  _Bool isbe_local;
  
  if (nvp->nvp_type == 5) {
    if ((*leftp < nvp->nvp_datasize) || (nvp->nvp_datasize == 0)) {
      piVar1 = __errno_location();
      *piVar1 = 0x16;
      puStack_10 = (uchar *)0x0;
    }
    else {
      nvl = nvlist_create(0);
      if (nvl == (nvlist_t *)0x0) {
        puStack_10 = (uchar *)0x0;
      }
      else {
        puStack_10 = nvlist_unpack_header(nvl,ptr,nfds,(_Bool *)0x0,leftp);
        if (puStack_10 == (uchar *)0x0) {
          puStack_10 = (uchar *)0x0;
        }
        else {
          nvp->nvp_data = (uint64_t)nvl;
          *child = nvl;
        }
      }
    }
    return puStack_10;
  }
  __assert_fail("nvp->nvp_type == 5",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                ,0x318,
                "const unsigned char *nvpair_unpack_nvlist(_Bool, nvpair_t *, const unsigned char *, size_t *, size_t, nvlist_t **)"
               );
}

Assistant:

const unsigned char *
nvpair_unpack_nvlist(bool isbe __unused, nvpair_t *nvp,
    const unsigned char *ptr, size_t *leftp, size_t nfds, nvlist_t **child)
{
	nvlist_t *value;

	PJDLOG_ASSERT(nvp->nvp_type == NV_TYPE_NVLIST);

	if (*leftp < nvp->nvp_datasize || nvp->nvp_datasize == 0) {
		ERRNO_SET(EINVAL);
		return (NULL);
	}

	value = nvlist_create(0);
	if (value == NULL)
		return (NULL);

	ptr = nvlist_unpack_header(value, ptr, nfds, NULL, leftp);
	if (ptr == NULL)
		return (NULL);

	nvp->nvp_data = (uint64_t)(uintptr_t)value;
	*child = value;

	return (ptr);
}